

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_build_parser.cpp
# Opt level: O0

int Omega_h::close(int __fd)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  int extraout_EAX;
  reference piVar4;
  reference pvVar5;
  const_reference pvVar6;
  const_reference pvVar7;
  const_reference pvVar8;
  NodeEdges *this;
  reference piVar9;
  size_type sVar10;
  iterator __first;
  iterator __last;
  ParserGraph *in_RCX;
  Grammar *in_RDX;
  vector<Omega_h::Config,_std::allocator<Omega_h::Config>_> *in_RSI;
  undefined4 in_register_0000003c;
  vector<int,std::allocator<int>> *this_00;
  int local_12c;
  const_iterator cStack_128;
  int sc;
  const_iterator __end2;
  const_iterator __begin2;
  NodeEdges *__range2;
  value_type symbol_after_dot;
  value_type *prod;
  int prod_i;
  value_type *config;
  value_type config_i_1;
  int local_c4;
  iterator iStack_c0;
  int config_i;
  iterator __end1;
  iterator __begin1;
  vector<int,_std::allocator<int>_> *__range1;
  set<int,_std::less<int>,_std::allocator<int>_> config_set;
  queue<int,_std::deque<int,_std::allocator<int>_>_> config_q;
  ParserGraph *lhs2sc_local;
  Grammar *grammar_local;
  Configs *cs_local;
  StateInProgress *state_local;
  
  this_00 = (vector<int,std::allocator<int>> *)CONCAT44(in_register_0000003c,__fd);
  std::queue<int,std::deque<int,std::allocator<int>>>::
  queue<std::deque<int,std::allocator<int>>,void>
            ((queue<int,std::deque<int,std::allocator<int>>> *)
             &config_set._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::set<int,_std::less<int>,_std::allocator<int>_>::set
            ((set<int,_std::less<int>,_std::allocator<int>_> *)&__range1);
  __end1 = std::vector<int,_std::allocator<int>_>::begin
                     ((vector<int,_std::allocator<int>_> *)this_00);
  iStack_c0 = std::vector<int,_std::allocator<int>_>::end
                        ((vector<int,_std::allocator<int>_> *)this_00);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=(&__end1,&stack0xffffffffffffff40);
    if (!bVar2) {
      while (bVar2 = std::queue<int,_std::deque<int,_std::allocator<int>_>_>::empty
                               ((queue<int,_std::deque<int,_std::allocator<int>_>_> *)
                                &config_set._M_t._M_impl.super__Rb_tree_header._M_node_count),
            ((bVar2 ^ 0xffU) & 1) != 0) {
        pvVar5 = std::queue<int,_std::deque<int,_std::allocator<int>_>_>::front
                           ((queue<int,_std::deque<int,_std::allocator<int>_>_> *)
                            &config_set._M_t._M_impl.super__Rb_tree_header._M_node_count);
        iVar1 = *pvVar5;
        std::queue<int,_std::deque<int,_std::allocator<int>_>_>::pop
                  ((queue<int,_std::deque<int,_std::allocator<int>_>_> *)
                   &config_set._M_t._M_impl.super__Rb_tree_header._M_node_count);
        pvVar6 = at<Omega_h::Config>(in_RSI,iVar1);
        pvVar7 = at<Omega_h::Grammar::Production>(&in_RDX->productions,pvVar6->production);
        iVar1 = pvVar6->dot;
        iVar3 = size<int>(&pvVar7->rhs);
        if (iVar1 != iVar3) {
          pvVar8 = at<int>(&pvVar7->rhs,pvVar6->dot);
          iVar1 = *pvVar8;
          bVar2 = is_terminal(in_RDX,iVar1);
          if (!bVar2) {
            this = get_edges(in_RCX,iVar1);
            __end2 = std::vector<int,_std::allocator<int>_>::begin(this);
            cStack_128 = std::vector<int,_std::allocator<int>_>::end(this);
            while (bVar2 = __gnu_cxx::operator!=(&__end2,&stack0xfffffffffffffed8), bVar2) {
              piVar9 = __gnu_cxx::
                       __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
                       operator*(&__end2);
              local_12c = *piVar9;
              sVar10 = std::set<int,_std::less<int>,_std::allocator<int>_>::count
                                 ((set<int,_std::less<int>,_std::allocator<int>_> *)&__range1,
                                  &local_12c);
              if (sVar10 == 0) {
                std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                          ((set<int,_std::less<int>,_std::allocator<int>_> *)&__range1,&local_12c);
                std::queue<int,_std::deque<int,_std::allocator<int>_>_>::push
                          ((queue<int,_std::deque<int,_std::allocator<int>_>_> *)
                           &config_set._M_t._M_impl.super__Rb_tree_header._M_node_count,&local_12c);
              }
              __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
              operator++(&__end2);
            }
          }
        }
      }
      __first = std::set<int,_std::less<int>,_std::allocator<int>_>::begin
                          ((set<int,_std::less<int>,_std::allocator<int>_> *)&__range1);
      __last = std::set<int,_std::less<int>,_std::allocator<int>_>::end
                         ((set<int,_std::less<int>,_std::allocator<int>_> *)&__range1);
      std::vector<int,std::allocator<int>>::assign<std::_Rb_tree_const_iterator<int>,void>
                (this_00,(_Rb_tree_const_iterator<int>)__first._M_node,
                 (_Rb_tree_const_iterator<int>)__last._M_node);
      std::set<int,_std::less<int>,_std::allocator<int>_>::~set
                ((set<int,_std::less<int>,_std::allocator<int>_> *)&__range1);
      std::queue<int,_std::deque<int,_std::allocator<int>_>_>::~queue
                ((queue<int,_std::deque<int,_std::allocator<int>_>_> *)
                 &config_set._M_t._M_impl.super__Rb_tree_header._M_node_count);
      return extraout_EAX;
    }
    piVar4 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                       (&__end1);
    local_c4 = *piVar4;
    std::queue<int,_std::deque<int,_std::allocator<int>_>_>::push
              ((queue<int,_std::deque<int,_std::allocator<int>_>_> *)
               &config_set._M_t._M_impl.super__Rb_tree_header._M_node_count,&local_c4);
    sVar10 = std::set<int,_std::less<int>,_std::allocator<int>_>::count
                       ((set<int,_std::less<int>,_std::allocator<int>_> *)&__range1,&local_c4);
    if (sVar10 != 0) break;
    std::set<int,_std::less<int>,_std::allocator<int>_>::insert
              ((set<int,_std::less<int>,_std::allocator<int>_> *)&__range1,&local_c4);
    __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              (&__end1);
  }
  fail("assertion %s failed at %s +%d\n","!config_set.count(config_i)",
       "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_build_parser.cpp"
       ,0x45);
}

Assistant:

static void close(StateInProgress& state, Configs const& cs,
    Grammar const& grammar, ParserGraph const& lhs2sc) {
  std::queue<int> config_q;
  std::set<int> config_set;
  for (auto config_i : state.configs) {
    config_q.push(config_i);
    OMEGA_H_CHECK(!config_set.count(config_i));
    config_set.insert(config_i);
  }
  while (!config_q.empty()) {
    auto config_i = config_q.front();
    config_q.pop();
    auto& config = at(cs, config_i);
    auto prod_i = config.production;
    auto& prod = at(grammar.productions, prod_i);
    if (config.dot == size(prod.rhs)) continue;
    auto symbol_after_dot = at(prod.rhs, config.dot);
    if (is_terminal(grammar, symbol_after_dot)) continue;
    for (auto sc : get_edges(lhs2sc, symbol_after_dot)) {
      if (!config_set.count(sc)) {
        config_set.insert(sc);
        config_q.push(sc);
      }
    }
  }
  state.configs.assign(config_set.begin(), config_set.end());
}